

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacBlast.c
# Opt level: O1

void Bac_NtkCreateAndConnectBuffer(Gia_Man_t *pGia,Gia_Obj_t *pObj,Bac_Ntk_t *p,int iTerm)

{
  Gia_Obj_t *pGVar1;
  uint uVar2;
  int iVar3;
  Bac_ObjType_t Type;
  
  if (pGia == (Gia_Man_t *)0x0) {
    Type = BAC_BOX_CF;
  }
  else {
    pGVar1 = pGia->pObjs;
    if ((pObj < pGVar1) || (pGVar1 + pGia->nObjs <= pObj)) {
      __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                    ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
    }
    iVar3 = (int)((ulong)((long)pObj - (long)pGVar1) >> 2);
    uVar2 = (uint)*(undefined8 *)pObj;
    if (SBORROW4(uVar2 & 0x1fffffff,iVar3 * -0x55555555) ==
        (int)((uVar2 & 0x1fffffff) + iVar3 * 0x55555555) < 0) {
      Type = ((uVar2 >> 0x1d & 1) != 0) + BAC_BOX_CF;
    }
    else {
      Bac_ObjAlloc(p,BAC_OBJ_BI,pObj[-(ulong)(uVar2 & 0x1fffffff)].Value);
      Type = BAC_BOX_INV - ((pObj->field_0x3 & 0x20) == 0);
    }
  }
  Bac_ObjAlloc(p,Type,-1);
  iVar3 = Bac_ObjAlloc(p,BAC_OBJ_BO,-1);
  Bac_ObjSetFanin(p,iTerm,iVar3);
  return;
}

Assistant:

void Bac_NtkCreateAndConnectBuffer( Gia_Man_t * pGia, Gia_Obj_t * pObj, Bac_Ntk_t * p, int iTerm )
{
    int iObj;
    if ( pGia && Gia_ObjFaninId0p(pGia, pObj) > 0 )
    {
        iObj = Bac_ObjAlloc( p, BAC_OBJ_BI, Gia_ObjFanin0(pObj)->Value );
        Bac_ObjAlloc( p, Gia_ObjFaninC0(pObj) ? BAC_BOX_INV : BAC_BOX_BUF, -1 );
    }
    else
    {
        Bac_ObjAlloc( p, pGia && Gia_ObjFaninC0(pObj) ? BAC_BOX_CT : BAC_BOX_CF, -1 );
    }
    iObj = Bac_ObjAlloc( p, BAC_OBJ_BO, -1 );
    Bac_ObjSetFanin( p, iTerm, iObj );
}